

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int xz_head(xz_statep state)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uchar *puVar4;
  uLong uVar5;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint len;
  int flags;
  lzma_stream init;
  lzma_stream *strm;
  xz_statep state_local;
  
  init._128_8_ = &state->strm;
  memset(&len,0,0x88);
  if (state->size == 0) {
    puVar4 = (uchar *)(*xmlMalloc)((size_t)state->want);
    state->in = puVar4;
    puVar4 = (uchar *)(*xmlMalloc)((size_t)(state->want << 1));
    state->out = puVar4;
    if ((state->in == (uchar *)0x0) || (state->out == (uchar *)0x0)) {
      if (state->out != (uchar *)0x0) {
        (*xmlFree)(state->out);
      }
      if (state->in != (uchar *)0x0) {
        (*xmlFree)(state->in);
      }
      xz_error(state,5,"out of memory");
      return -1;
    }
    state->size = state->want;
    memcpy(&state->strm,&len,0x88);
    (state->strm).avail_in = 0;
    (state->strm).next_in = (uint8_t *)0x0;
    iVar3 = lzma_auto_decoder(&state->strm,100000000,0);
    if (iVar3 != 0) {
      (*xmlFree)(state->out);
      (*xmlFree)(state->in);
      state->size = 0;
      xz_error(state,5,"out of memory");
      return -1;
    }
    (state->zstrm).zalloc = (alloc_func)0x0;
    (state->zstrm).zfree = (free_func)0x0;
    (state->zstrm).opaque = (voidpf)0x0;
    (state->zstrm).avail_in = 0;
    (state->zstrm).next_in = (Bytef *)0x0;
    if (state->init == 0) {
      iVar3 = inflateInit2_(&state->zstrm,0xfffffff1,"1.2.11",0x70);
      if (iVar3 != 0) {
        (*xmlFree)(state->out);
        (*xmlFree)(state->in);
        state->size = 0;
        xz_error(state,5,"out of memory");
        return -1;
      }
      state->init = 1;
    }
  }
  if (*(long *)(init._128_8_ + 8) == 0) {
    iVar3 = xz_avail(state);
    if (iVar3 == -1) {
      return -1;
    }
    if (*(long *)(init._128_8_ + 8) == 0) {
      return 0;
    }
  }
  iVar3 = is_format_xz(state);
  if ((iVar3 != 0) || (iVar3 = is_format_lzma(state), iVar3 != 0)) {
    state->how = 3;
    state->direct = 0;
    return 0;
  }
  if (**(char **)init._128_8_ == '\x1f') {
    *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
    *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
    if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
      return -1;
    }
    if ((*(long *)(init._128_8_ + 8) != 0) && (**(char **)init._128_8_ == -0x75)) {
      *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
      *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
        local_b4 = 0xffffffff;
      }
      else {
        if (*(long *)(init._128_8_ + 8) == 0) {
          local_b8 = 0xffffffff;
        }
        else {
          *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
          pbVar2 = *(byte **)init._128_8_;
          *(byte **)init._128_8_ = pbVar2 + 1;
          local_b8 = (uint)*pbVar2;
        }
        local_b4 = local_b8;
      }
      if (local_b4 != 8) {
        xz_error(state,9,"unknown compression method");
        return -1;
      }
      if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
        bVar1 = 0xff;
      }
      else if (*(long *)(init._128_8_ + 8) == 0) {
        bVar1 = 0xff;
      }
      else {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        pbVar2 = *(byte **)init._128_8_;
        *(byte **)init._128_8_ = pbVar2 + 1;
        bVar1 = *pbVar2;
      }
      if ((bVar1 & 0xe0) != 0) {
        xz_error(state,9,"unknown header flags set");
        return -1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
         (*(long *)(init._128_8_ + 8) != 0)) {
        *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
        *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
      }
      if ((bVar1 & 4) != 0) {
        if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
          local_dc = 0xffffffff;
        }
        else {
          if (*(long *)(init._128_8_ + 8) == 0) {
            local_e0 = 0xffffffff;
          }
          else {
            *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
            pbVar2 = *(byte **)init._128_8_;
            *(byte **)init._128_8_ = pbVar2 + 1;
            local_e0 = (uint)*pbVar2;
          }
          local_dc = local_e0;
        }
        if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
          local_e4 = 0xffffffff;
        }
        else {
          if (*(long *)(init._128_8_ + 8) == 0) {
            local_e8 = 0xffffffff;
          }
          else {
            *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
            pbVar2 = *(byte **)init._128_8_;
            *(byte **)init._128_8_ = pbVar2 + 1;
            local_e8 = (uint)*pbVar2;
          }
          local_e4 = local_e8;
        }
        local_b0 = local_e4 * 0x100 + local_dc;
        do {
          if (local_b0 == 0) break;
          if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
            local_ec = 0xffffffff;
          }
          else {
            if (*(long *)(init._128_8_ + 8) == 0) {
              local_f0 = 0xffffffff;
            }
            else {
              *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
              pbVar2 = *(byte **)init._128_8_;
              *(byte **)init._128_8_ = pbVar2 + 1;
              local_f0 = (uint)*pbVar2;
            }
            local_ec = local_f0;
          }
          local_b0 = local_b0 + -1;
        } while (-1 < (int)local_ec);
      }
      if ((bVar1 & 8) != 0) {
        do {
          if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
            local_f4 = 0xffffffff;
          }
          else {
            if (*(long *)(init._128_8_ + 8) == 0) {
              local_f8 = 0xffffffff;
            }
            else {
              *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
              pbVar2 = *(byte **)init._128_8_;
              *(byte **)init._128_8_ = pbVar2 + 1;
              local_f8 = (uint)*pbVar2;
            }
            local_f4 = local_f8;
          }
        } while (0 < (int)local_f4);
      }
      if ((bVar1 & 0x10) != 0) {
        do {
          if ((*(long *)(init._128_8_ + 8) == 0) && (iVar3 = xz_avail(state), iVar3 == -1)) {
            local_fc = 0xffffffff;
          }
          else {
            if (*(long *)(init._128_8_ + 8) == 0) {
              local_100 = 0xffffffff;
            }
            else {
              *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
              pbVar2 = *(byte **)init._128_8_;
              *(byte **)init._128_8_ = pbVar2 + 1;
              local_100 = (uint)*pbVar2;
            }
            local_fc = local_100;
          }
        } while (0 < (int)local_fc);
      }
      if ((bVar1 & 2) != 0) {
        if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
           (*(long *)(init._128_8_ + 8) != 0)) {
          *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
          *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
        }
        if (((*(long *)(init._128_8_ + 8) != 0) || (iVar3 = xz_avail(state), iVar3 != -1)) &&
           (*(long *)(init._128_8_ + 8) != 0)) {
          *(long *)(init._128_8_ + 8) = *(long *)(init._128_8_ + 8) + -1;
          *(long *)init._128_8_ = *(long *)init._128_8_ + 1;
        }
      }
      inflateReset(&state->zstrm);
      uVar5 = crc32(0,0,0);
      (state->zstrm).adler = uVar5;
      state->how = 2;
      state->direct = 0;
      return 0;
    }
    *state->out = '\x1f';
    state->have = 1;
  }
  state->raw = state->pos;
  state->next = state->out;
  if (*(long *)(init._128_8_ + 8) != 0) {
    memcpy(state->next + state->have,*(void **)init._128_8_,*(size_t *)(init._128_8_ + 8));
    state->have = state->have + (int)*(undefined8 *)(init._128_8_ + 8);
    *(undefined8 *)(init._128_8_ + 8) = 0;
  }
  state->how = 1;
  state->direct = 1;
  return 0;
}

Assistant:

static int
xz_head(xz_statep state)
{
    lzma_stream *strm = &(state->strm);
    lzma_stream init = LZMA_STREAM_INIT;
    int flags;
    unsigned len;

    /* allocate read buffers and inflate memory */
    if (state->size == 0) {
        /* allocate buffers */
        state->in = xmlMalloc(state->want);
        state->out = xmlMalloc(state->want << 1);
        if (state->in == NULL || state->out == NULL) {
            if (state->out != NULL)
                xmlFree(state->out);
            if (state->in != NULL)
                xmlFree(state->in);
            xz_error(state, LZMA_MEM_ERROR, "out of memory");
            return -1;
        }
        state->size = state->want;

        /* allocate decoder memory */
        state->strm = init;
        state->strm.avail_in = 0;
        state->strm.next_in = NULL;
        if (lzma_auto_decoder(&state->strm, 100000000, 0) != LZMA_OK) {
            xmlFree(state->out);
            xmlFree(state->in);
            state->size = 0;
            xz_error(state, LZMA_MEM_ERROR, "out of memory");
            return -1;
        }
#ifdef LIBXML_ZLIB_ENABLED
        /* allocate inflate memory */
        state->zstrm.zalloc = Z_NULL;
        state->zstrm.zfree = Z_NULL;
        state->zstrm.opaque = Z_NULL;
        state->zstrm.avail_in = 0;
        state->zstrm.next_in = Z_NULL;
        if (state->init == 0) {
            if (inflateInit2(&(state->zstrm), -15) != Z_OK) {/* raw inflate */
                xmlFree(state->out);
                xmlFree(state->in);
                state->size = 0;
                xz_error(state, LZMA_MEM_ERROR, "out of memory");
                return -1;
            }
            state->init = 1;
        }
#endif
    }

    /* get some data in the input buffer */
    if (strm->avail_in == 0) {
        if (xz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0)
            return 0;
    }

    /* look for the xz magic header bytes */
    if (is_format_xz(state) || is_format_lzma(state)) {
        state->how = LZMA;
        state->direct = 0;
        return 0;
    }
#ifdef LIBXML_ZLIB_ENABLED
    /* look for the gzip magic header bytes 31 and 139 */
    if (strm->next_in[0] == 31) {
        strm->avail_in--;
        strm->next_in++;
        if (strm->avail_in == 0 && xz_avail(state) == -1)
            return -1;
        if (strm->avail_in && strm->next_in[0] == 139) {
            /* we have a gzip header, woo hoo! */
            strm->avail_in--;
            strm->next_in++;

            /* skip rest of header */
            if (NEXT() != 8) {  /* compression method */
                xz_error(state, LZMA_DATA_ERROR,
                         "unknown compression method");
                return -1;
            }
            flags = NEXT();
            if (flags & 0xe0) { /* reserved flag bits */
                xz_error(state, LZMA_DATA_ERROR,
                         "unknown header flags set");
                return -1;
            }
            NEXT();             /* modification time */
            NEXT();
            NEXT();
            NEXT();
            NEXT();             /* extra flags */
            NEXT();             /* operating system */
            if (flags & 4) {    /* extra field */
                len = (unsigned) NEXT();
                len += (unsigned) NEXT() << 8;
                while (len--)
                    if (NEXT() < 0)
                        break;
            }
            if (flags & 8)      /* file name */
                while (NEXT() > 0) ;
            if (flags & 16)     /* comment */
                while (NEXT() > 0) ;
            if (flags & 2) {    /* header crc */
                NEXT();
                NEXT();
            }
            /* an unexpected end of file is not checked for here -- it will be
             * noticed on the first request for uncompressed data */

            /* set up for decompression */
            inflateReset(&state->zstrm);
            state->zstrm.adler = crc32(0L, Z_NULL, 0);
            state->how = GZIP;
            state->direct = 0;
            return 0;
        } else {
            /* not a gzip file -- save first byte (31) and fall to raw i/o */
            state->out[0] = 31;
            state->have = 1;
        }
    }
#endif

    /* doing raw i/o, save start of raw data for seeking, copy any leftover
     * input to output -- this assumes that the output buffer is larger than
     * the input buffer, which also assures space for gzungetc() */
    state->raw = state->pos;
    state->next = state->out;
    if (strm->avail_in) {
        memcpy(state->next + state->have, strm->next_in, strm->avail_in);
        state->have += strm->avail_in;
        strm->avail_in = 0;
    }
    state->how = COPY;
    state->direct = 1;
    return 0;
}